

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareMultiplierStandardUnit_Test::TestBody(Units_compareMultiplierStandardUnit_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  double dVar3;
  allocator<char> local_60 [8];
  AssertHelper local_58 [8];
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)&u2);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"",(allocator<char> *)&u2);
  libcellml::Units::addUnit
            ((StandardUnit)
             u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1,1.0,500.0,
             (string *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u2",local_60);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"",local_60);
  libcellml::Units::addUnit
            ((StandardUnit)
             u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1,1.0,1.0,
             (string *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  dVar3 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  testing::internal::DoubleNearPredFormat
            (&gtest_ar.success_,"0.002","libcellml::Units::scalingFactor(u1, u2)",0.002,dVar3,1e-12)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_60);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x411,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  dVar3 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u2,(shared_ptr *)&u1,true);
  testing::internal::DoubleNearPredFormat
            (&gtest_ar.success_,"500.0","libcellml::Units::scalingFactor(u2, u1)",500.0,dVar3,1e-12)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x412,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compareMultiplierStandardUnit)
{
    // u1 = 1000*u2
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 500.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 1.0);

    EXPECT_NEAR(0.002, libcellml::Units::scalingFactor(u1, u2), 1e-12);
    EXPECT_NEAR(500.0, libcellml::Units::scalingFactor(u2, u1), 1e-12);
}